

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ImGuiDataType IVar5;
  ImGuiDataType extraout_EDX;
  ImGuiDataType extraout_EDX_00;
  ImGuiDataType extraout_EDX_01;
  ImGuiDataType extraout_EDX_02;
  ImGuiDataType extraout_EDX_03;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  ImVec2 local_38;
  
  pIVar1 = GImGui;
  IVar5 = (ImGuiDataType)format;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    v_speed = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
  }
  uVar7 = (flags & 0x100000U) >> 0x14;
  uVar6 = data_type & 0xfffffffe;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar2 = IsMousePosValid((ImVec2 *)0x0);
    IVar5 = extraout_EDX;
    if (!bVar2) goto LAB_002439f8;
    bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5);
    IVar5 = extraout_EDX_00;
    if (!bVar2) goto LAB_002439f8;
    fVar12 = (pIVar1->IO).NavInputs[(ulong)uVar7 + 0x1d];
    if ((pIVar1->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar1->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  else {
LAB_002439f8:
    fVar12 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar3 = 0;
      if (uVar6 == 8) {
        uVar3 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar12 = (&local_38.x)[uVar7];
      IVar5 = extraout_EDX_01;
      if ((int)uVar3 < 0) {
        fVar9 = 1.1754944e-38;
      }
      else if ((int)uVar3 < 10) {
        fVar9 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar3 * 4);
      }
      else {
        fVar9 = powf(10.0,(float)(int)-uVar3);
        IVar5 = extraout_EDX_02;
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar9 <= v_speed) |
                       ~-(uint)(fVar9 <= v_speed) & (uint)fVar9);
    }
  }
  fVar12 = fVar12 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar12 = -fVar12;
  }
  if ((((flags & 0x20U) != 0) && (dVar10 = v_max - v_min, dVar10 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar10)) {
    fVar12 = fVar12 / (float)dVar10;
  }
  if (v_min < v_max) {
    dVar10 = *v;
    if ((dVar10 < v_max) || (bVar2 = true, fVar12 <= 0.0)) {
      IVar5 = CONCAT31((int3)((uint)IVar5 >> 8),dVar10 <= v_min);
      bVar2 = fVar12 < 0.0 && dVar10 <= v_min;
    }
  }
  else {
    bVar2 = false;
  }
  if ((pIVar1->ActiveIdIsJustActivated != false) || (bVar2)) {
    pIVar1->DragCurrentAccum = 0.0;
    bVar2 = false;
  }
  else {
    if ((fVar12 == 0.0) && (!NAN(fVar12))) goto LAB_00243b7e;
    pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum + fVar12;
    bVar2 = true;
  }
  pIVar1->DragCurrentAccumDirty = bVar2;
LAB_00243b7e:
  if (pIVar1->DragCurrentAccumDirty == true) {
    dVar10 = *v;
    if ((flags & 0x20U) == 0) {
      dVar10 = dVar10 + (double)pIVar1->DragCurrentAccum;
      fVar9 = 0.0;
      dVar11 = 0.0;
    }
    else {
      if (uVar6 == 8) {
        iVar4 = ImParseFormatPrecision(format,3);
        fVar9 = (float)iVar4;
      }
      else {
        fVar9 = 1.0;
      }
      fVar9 = powf(0.1,fVar9);
      fVar8 = ScaleRatioFromValueT<double,double,double>
                        (data_type,dVar10,v_min,v_max,true,fVar9,0.0);
      dVar10 = ScaleValueFromRatioT<double,double,double>
                         (data_type,pIVar1->DragCurrentAccum + fVar8,v_min,v_max,true,fVar9,0.0);
      dVar11 = (double)fVar8;
      IVar5 = extraout_EDX_03;
    }
    if ((flags & 0x40U) == 0) {
      dVar10 = RoundScalarWithFormatT<double,double>
                         ((ImGui *)format,(char *)(ulong)(uint)data_type,IVar5,dVar10);
    }
    pIVar1->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      dVar11 = dVar10 - *v;
    }
    else {
      fVar9 = ScaleRatioFromValueT<double,double,double>
                        (data_type,dVar10,v_min,v_max,true,fVar9,0.0);
      dVar11 = (double)fVar9 - dVar11;
    }
    pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)dVar11;
    dVar10 = (double)(~-(ulong)(dVar10 == 0.0) & (ulong)dVar10);
    dVar11 = *v;
    if (v_min < v_max) {
      if ((dVar11 != dVar10) || (NAN(dVar11) || NAN(dVar10))) {
        if ((dVar10 < v_min) || (((uVar6 != 8 && (dVar11 < dVar10)) && (fVar12 < 0.0)))) {
          dVar10 = v_min;
        }
        if ((v_max < dVar10) || (((uVar6 != 8 && (dVar10 < dVar11)) && (0.0 < fVar12)))) {
          dVar10 = v_max;
        }
      }
    }
    if ((dVar11 != dVar10) || (NAN(dVar11) || NAN(dVar10))) {
      *v = dVar10;
      bVar2 = true;
    }
    else {
      bVar2 = (bool)(-(dVar11 != dVar10) & 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}